

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O0

int test_pattern(GlobalVars *gv,char **fpat,char ***spatlist)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  char *pcVar6;
  char *in_RDX;
  GlobalVars *in_RSI;
  char *keyword;
  char c;
  char ***in_stack_00000210;
  char **in_stack_00000218;
  char *in_stack_00000220;
  GlobalVars *in_stack_00000228;
  uint32_t in_stack_ffffffffffffffdc;
  
  if (secdefbase == (char *)0x0) {
    secdefbase = gettxtptr();
    secdefline = getlineno();
  }
  (in_RSI->libpaths).first = (node *)0x0;
  in_RDX[0] = '\0';
  in_RDX[1] = '\0';
  in_RDX[2] = '\0';
  in_RDX[3] = '\0';
  in_RDX[4] = '\0';
  in_RDX[5] = '\0';
  in_RDX[6] = '\0';
  in_RDX[7] = '\0';
  level = 2;
  do {
    while( true ) {
      while( true ) {
        do {
          while (pcVar6 = getpattern(), pcVar6 == (char *)0x0) {
            cVar2 = getchr();
            if (cVar2 != ';') {
              back(1);
              level = 1;
              return 0;
            }
          }
          iVar3 = check_command(in_RSI,in_RDX,in_stack_ffffffffffffffdc);
        } while (iVar3 != 0);
        cVar2 = getchr();
        pcVar1 = scriptname;
        in_stack_ffffffffffffffdc = CONCAT13(cVar2,(int3)in_stack_ffffffffffffffdc);
        if (cVar2 != '=') break;
        skip_expr(0);
      }
      if (cVar2 == '(') break;
      uVar5 = getlineno();
      error(0x41,pcVar1,(ulong)uVar5,pcVar6);
      back(1);
    }
    bVar4 = parse_pattern(in_stack_00000228,in_stack_00000220,in_stack_00000218,in_stack_00000210);
  } while (bVar4 == 0);
  return 1;
}

Assistant:

int test_pattern(struct GlobalVars *gv,char **fpat,char ***spatlist)
/* Returns next file/section-patterns, but doesn't execute any commands
   or assignments. It will remember the initial parsing state to
   do it a second time for real with next_pattern(). */
{
  char c,*keyword;

  if (!secdefbase) {
    secdefbase = gettxtptr();
    secdefline = getlineno();
  }
  *fpat = NULL;
  *spatlist = NULL;
  level = 2;

  do {
    while (keyword = getpattern()) {
      if (check_command(gv,keyword,SCMDF_IGNORE)) {
        continue;
      }
      else {
        c = getchr();
        if (c == '=') {
          skip_expr(0);
        }
        else if (c == '(') {
          if (parse_pattern(gv,keyword,fpat,spatlist))
            return 1;
        }
        else {
          /* unknown keyword ignored */
          error(65,scriptname,getlineno(),keyword);
          back(1);
        }
      }
    }
  }
  while (getchr() == ';');
  back(1);

  level = 1;
  return 0;
}